

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_fs_window.c
# Opt level: O1

void redraw(void)

{
  ALLEGRO_FONT *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  float fVar13;
  
  iVar2 = al_get_display_width(display);
  iVar3 = al_get_display_height(display);
  iVar4 = al_get_bitmap_width(picture);
  iVar5 = al_get_bitmap_height(picture);
  iVar6 = al_get_font_line_height(font);
  fVar13 = (float)(iVar3 - iVar5) * 0.5;
  uVar11 = 0x3f800000;
  uVar9 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
  uVar12 = 0x3f333333;
  al_map_rgb_f(0x3f4ccccd,0x3f333333,0x3f666666);
  al_clear_to_color();
  uVar10 = al_map_rgb(0xff,0,0);
  al_draw_line(0,0,(float)iVar2,(float)iVar3,uVar10,uVar12,0);
  al_draw_line(0,(float)iVar3,(float)iVar2,0,uVar10,uVar12,0);
  al_draw_bitmap((float)(iVar2 - iVar4) * 0.5,fVar13,picture,0);
  fVar13 = (float)iVar5 + fVar13;
  al_draw_textf(uVar9,uVar11,font,1,"Press Space to toggle fullscreen");
  al_draw_textf(uVar9,uVar11,(float)(iVar2 / 2),(float)iVar6 + fVar13,font,1,
                "Press Enter to toggle window size");
  pAVar1 = font;
  uVar10 = al_get_display_width(display);
  uVar12 = al_get_display_height(display);
  uVar7 = al_get_display_flags(display);
  pcVar8 = "fullscreen";
  if ((uVar7 >> 9 & 1) == 0) {
    pcVar8 = "not fullscreen";
  }
  al_draw_textf(uVar9,uVar11,(float)(iVar2 / 2),(float)(iVar6 * 2) + fVar13,pAVar1,1,
                "Window: %dx%d (%s)",uVar10,uVar12,pcVar8);
  al_flip_display();
  return;
}

Assistant:

static void redraw(void)
{
   ALLEGRO_COLOR color;
   int w = al_get_display_width(display);
   int h = al_get_display_height(display);
   int pw = al_get_bitmap_width(picture);
   int ph = al_get_bitmap_height(picture);
   int th = al_get_font_line_height(font);
   float cx =  (w - pw) * 0.5;
   float cy =  (h - ph) * 0.5;
   ALLEGRO_COLOR white = al_map_rgb_f(1, 1, 1);

   color = al_map_rgb_f(0.8, 0.7, 0.9);
   al_clear_to_color(color);

   color = al_map_rgb(255, 0, 0);
   al_draw_line(0, 0, w, h, color, 0);
   al_draw_line(0, h, w, 0, color, 0);

   al_draw_bitmap(picture, cx, cy, 0);
   
   al_draw_textf(font, white, w / 2, cy + ph, ALLEGRO_ALIGN_CENTRE,
      "Press Space to toggle fullscreen");
   al_draw_textf(font, white, w / 2, cy + ph + th, ALLEGRO_ALIGN_CENTRE,
      "Press Enter to toggle window size");
   al_draw_textf(font, white, w / 2, cy + ph + th * 2, ALLEGRO_ALIGN_CENTRE,
      "Window: %dx%d (%s)",
      al_get_display_width(display), al_get_display_height(display),
      (al_get_display_flags(display) & ALLEGRO_FULLSCREEN_WINDOW) ?
      "fullscreen" : "not fullscreen");
   
   al_flip_display();
}